

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::AggressiveDCEPass::AddDebugInstructionsToWorkList
          (AggressiveDCEPass *this,Instruction *inst)

{
  bool bVar1;
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *this_00;
  reference this_01;
  Instruction *line_inst;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *__range2;
  Instruction *inst_local;
  AggressiveDCEPass *this_local;
  
  this_00 = opt::Instruction::dbg_line_insts(inst);
  __end2 = std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
           begin(this_00);
  line_inst = (Instruction *)
              std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
              end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
                                     *)&line_inst), bVar1) {
    this_01 = __gnu_cxx::
              __normal_iterator<const_spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
              ::operator*(&__end2);
    bVar1 = opt::Instruction::IsDebugLineInst(this_01);
    if (bVar1) {
      AddOperandsToWorkList(this,this_01);
    }
    AddDebugScopeToWorkList(this,this_01);
    __gnu_cxx::
    __normal_iterator<const_spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
    ::operator++(&__end2);
  }
  AddDebugScopeToWorkList(this,inst);
  return;
}

Assistant:

void AggressiveDCEPass::AddDebugInstructionsToWorkList(
    const Instruction* inst) {
  for (auto& line_inst : inst->dbg_line_insts()) {
    if (line_inst.IsDebugLineInst()) {
      AddOperandsToWorkList(&line_inst);
    }
    AddDebugScopeToWorkList(&line_inst);
  }
  AddDebugScopeToWorkList(inst);
}